

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

int Gia_ManCountMark1Dfs_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pObj_00 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 == 0) {
      p_local._4_4_ = (uint)((ulong)*(undefined8 *)pObj_00 >> 0x3e) & 1;
    }
    else {
      iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
      iVar1 = Gia_ManCountMark1Dfs_rec(p,iVar1);
      iVar2 = Gia_ObjFaninId1(pObj_00,iObj);
      iVar2 = Gia_ManCountMark1Dfs_rec(p,iVar2);
      p_local._4_4_ = iVar1 + iVar2 + ((uint)((ulong)*(undefined8 *)pObj_00 >> 0x3e) & 1);
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManCountMark1Dfs_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 0;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( !Gia_ObjIsAnd(pObj) )
        return pObj->fMark1;
    return Gia_ManCountMark1Dfs_rec( p, Gia_ObjFaninId0(pObj, iObj) ) + 
           Gia_ManCountMark1Dfs_rec( p, Gia_ObjFaninId1(pObj, iObj) ) + pObj->fMark1;
}